

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.hpp
# Opt level: O3

Inst * __thiscall mir::inst::AssignInst::deep_copy(AssignInst *this)

{
  uint32_t uVar1;
  Inst *pIVar2;
  _Array_type *__vtable;
  anon_class_8_1_a78179b7_conflict local_58;
  undefined **local_50;
  VarId local_48;
  char local_38;
  undefined2 local_37;
  
  pIVar2 = (Inst *)operator_new(0x38);
  uVar1 = (this->super_Inst).dest.id;
  local_38 = (this->src).field_0x18;
  local_58.__lhs = (_Copy_ctor_base<false,_int,_mir::inst::VarId> *)&local_48;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
    ::_S_vtable._M_arr[(long)local_38 + 1]._M_data)
            (&local_58,(variant<int,_mir::inst::VarId> *)&(this->src).field_0x8);
  local_50 = &PTR_display_001ecf98;
  local_37._0_1_ = (this->src).shift;
  local_37._1_1_ = (this->src).shift_amount;
  (pIVar2->dest).super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
  (pIVar2->dest).id = uVar1;
  (pIVar2->super_Displayable)._vptr_Displayable = (_func_int **)&PTR_display_001ecfe8;
  local_58.__lhs = (_Copy_ctor_base<false,_int,_mir::inst::VarId> *)&pIVar2[1].dest;
  *(char *)&pIVar2[2].super_Displayable._vptr_Displayable = local_38;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
    ::_S_vtable._M_arr[(long)local_38 + 1]._M_data)
            (&local_58,(variant<int,_mir::inst::VarId> *)&local_48);
  pIVar2[1].super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ecf98;
  *(undefined2 *)((long)&pIVar2[2].super_Displayable._vptr_Displayable + 1) = local_37;
  return pIVar2;
}

Assistant:

Inst* deep_copy() { return new AssignInst(dest, src); }